

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O1

void device_reset_qsound(void *info)

{
  byte *pbVar1;
  long lVar2;
  qsound_state *chip;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  pbVar1 = (byte *)((long)info + 0x28);
  lVar2 = 0;
  uVar3 = 0;
  do {
    uVar3 = uVar3 | (uint)*pbVar1 << ((byte)lVar2 & 0x1f);
    lVar2 = lVar2 + 1;
    pbVar1 = pbVar1 + 0x24;
  } while (lVar2 != 0x10);
  lVar5 = 0;
  memset((void *)((long)info + 8),0,0x240);
  lVar2 = (long)info + 0x28;
  do {
    *(bool *)lVar2 = (uVar3 >> ((uint)lVar5 & 0x1f) & 1) != 0;
    lVar5 = lVar5 + 1;
    lVar2 = lVar2 + 0x24;
  } while (lVar5 != 0x10);
  iVar4 = 0x80;
  do {
    iVar4 = iVar4 + -1;
    qsound_write_data(info,(UINT8)iVar4,0);
  } while (iVar4 != 0);
  iVar4 = -0x10;
  do {
    qsound_write_data(info,(char)iVar4 + 0x90,0x120);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0);
  return;
}

Assistant:

static void device_reset_qsound(void *info)
{
	qsound_state *chip = (qsound_state *)info;
	UINT32 muteMask;
	int adr;

	muteMask = qsound_get_mute_mask(chip);
	// init sound regs
	memset(chip->channel, 0, sizeof(chip->channel));
	qsound_set_mute_mask(chip, muteMask);

	for (adr = 0x7f; adr >= 0; adr--)
		qsound_write_data(chip, adr, 0);
	for (adr = 0x80; adr < 0x90; adr++)
		qsound_write_data(chip, adr, 0x120);

	return;
}